

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryUriComponent
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          undefined8 param_3,ushort param_4)

{
  byte bVar1;
  size_t sVar2;
  NullableValue<unsigned_int> NVar3;
  NullableValue<unsigned_int> *pNVar4;
  uint *puVar5;
  Array<unsigned_char> local_b8;
  int local_9c;
  char local_95;
  Maybe<unsigned_int> local_94;
  NullableValue<unsigned_int> local_8c;
  NullableValue<unsigned_int> d2;
  byte b;
  NullableValue<unsigned_int> local_78;
  NullableValue<unsigned_int> d1;
  char *end;
  NullableValue<unsigned_int> local_58;
  char *ptr;
  undefined1 local_48 [7];
  bool hadErrors;
  Vector<unsigned_char> result;
  undefined1 auStack_20 [6];
  DecodeUriOptions options_local;
  ArrayPtr<const_char> text_local;
  
  result.builder.disposer._6_2_ = param_4;
  _auStack_20 = this;
  sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
  Vector<unsigned_char>::Vector
            ((Vector<unsigned_char> *)local_48,sVar2 + (result.builder.disposer._6_1_ & 1));
  ptr._7_1_ = false;
  local_58 = (NullableValue<unsigned_int>)
             ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)auStack_20);
  d1 = (NullableValue<unsigned_int>)ArrayPtr<const_char>::end((ArrayPtr<const_char> *)auStack_20);
  while ((ulong)local_58 < (ulong)d1) {
    if (*(char *)local_58 == '%') {
      NVar3 = (NullableValue<unsigned_int>)((long)local_58 + 1);
      if (NVar3 == d1) {
        ptr._7_1_ = true;
        local_58 = NVar3;
      }
      else {
        anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&d2.field_1,*(char *)NVar3);
        pNVar4 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&d2.field_1);
        _::NullableValue<unsigned_int>::NullableValue(&local_78,pNVar4);
        Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&d2.field_1);
        puVar5 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_78);
        if (puVar5 == (uint *)0x0) {
          ptr._7_1_ = true;
          local_58 = NVar3;
        }
        else {
          puVar5 = _::NullableValue<unsigned_int>::operator*(&local_78);
          d2._3_1_ = SUB41(*puVar5,0);
          NVar3 = (NullableValue<unsigned_int>)((long)local_58 + 2);
          if (NVar3 == d1) {
            ptr._7_1_ = true;
            local_58 = NVar3;
          }
          else {
            anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&local_94,*(char *)NVar3);
            pNVar4 = _::readMaybe<unsigned_int>(&local_94);
            _::NullableValue<unsigned_int>::NullableValue(&local_8c,pNVar4);
            Maybe<unsigned_int>::~Maybe(&local_94);
            puVar5 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_8c);
            if (puVar5 == (uint *)0x0) {
              ptr._7_1_ = true;
              local_58 = NVar3;
            }
            else {
              bVar1 = d2._3_1_ << 4;
              puVar5 = _::NullableValue<unsigned_int>::operator*(&local_8c);
              d2._3_1_ = bVar1 | (byte)*puVar5;
              local_58 = (NullableValue<unsigned_int>)((long)local_58 + 3);
            }
            _::NullableValue<unsigned_int>::~NullableValue(&local_8c);
          }
          Vector<unsigned_char>::add<unsigned_char&>
                    ((Vector<unsigned_char> *)local_48,&d2.field_0x3);
        }
        _::NullableValue<unsigned_int>::~NullableValue(&local_78);
      }
    }
    else {
      if (((result.builder.disposer._6_2_ & 0x100) == 0) || (*(char *)local_58 != '+')) {
        Vector<unsigned_char>::add<char_const&>((Vector<unsigned_char> *)local_48,(char *)local_58);
      }
      else {
        local_95 = ' ';
        Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,&local_95);
      }
      local_58 = (NullableValue<unsigned_int>)((long)local_58 + 1);
    }
  }
  if ((result.builder.disposer._6_2_ & 1) != 0) {
    local_9c = 0;
    Vector<unsigned_char>::add<int>((Vector<unsigned_char> *)local_48,&local_9c);
  }
  Vector<unsigned_char>::releaseAsArray(&local_b8,(Vector<unsigned_char> *)local_48);
  EncodingResult<kj::Array<unsigned_char>_>::EncodingResult
            (__return_storage_ptr__,&local_b8,ptr._7_1_);
  Array<unsigned_char>::~Array(&local_b8);
  Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryUriComponent(
    ArrayPtr<const char> text, DecodeUriOptions options) {
  Vector<byte> result(text.size() + options.nulTerminate);
  bool hadErrors = false;

  const char* ptr = text.begin();
  const char* end = text.end();
  while (ptr < end) {
    if (*ptr == '%') {
      ++ptr;

      if (ptr == end) {
        hadErrors = true;
      } else KJ_IF_MAYBE(d1, tryFromHexDigit(*ptr)) {
        byte b = *d1;
        ++ptr;
        if (ptr == end) {
          hadErrors = true;
        } else KJ_IF_MAYBE(d2, tryFromHexDigit(*ptr)) {
          b = (b << 4) | *d2;
          ++ptr;
        } else {
          hadErrors = true;
        }
        result.add(b);
      } else {
        hadErrors = true;
      }
    } else if (options.plusToSpace && *ptr == '+') {
      ++ptr;
      result.add(' ');
    } else {
      result.add(*ptr++);
    }
  }